

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O2

void empty_queue(event_path_data evp,queue_ptr queue)

{
  queue_item *pqVar1;
  event_path_data __ptr;
  queue_item *tmp;
  
  while ((__ptr = (event_path_data)queue->queue_head, __ptr != (event_path_data)0x0 &&
         (queue->queue_tail != (queue_item *)0x0))) {
    return_event(evp,*(event_item **)__ptr);
    if (queue->queue_head == queue->queue_tail) {
      queue->queue_tail = (queue_item *)0x0;
      pqVar1 = (queue_item *)0x0;
    }
    else {
      pqVar1 = queue->queue_head->next;
    }
    queue->queue_head = pqVar1;
    free(__ptr);
    evp = __ptr;
  }
  return;
}

Assistant:

static void
empty_queue(event_path_data evp, queue_ptr queue)
{
    while(queue->queue_head != NULL && queue->queue_tail != NULL) {
	queue_item *tmp = queue->queue_head;
	return_event(evp, queue->queue_head->item);
        if(queue->queue_head == queue->queue_tail) {
	    queue->queue_head = NULL;
	    queue->queue_tail = NULL;
	} else {
	    queue->queue_head = queue->queue_head->next;
	}
	free(tmp);
    }
}